

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O2

void anon_unknown.dwarf_43183::testScanLineWithBadAttribute(char *file)

{
  int iVar1;
  char *pcVar2;
  MultiPartInputFile *pMVar3;
  InputPart ip;
  TiledInputPart p;
  TiledInputFile f;
  MultiPartInputFile multiin;
  InputFile in;
  
  iVar1 = Imf_3_4::globalThreadCount();
  pcVar2 = file;
  Imf_3_4::InputFile::InputFile(&in,file,iVar1);
  readScanlineThing<Imf_3_4::InputFile>(&in,SUB81(pcVar2,0));
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(&multiin,file,iVar1,true);
  pMVar3 = &multiin;
  Imf_3_4::InputPart::InputPart(&ip,pMVar3,0);
  readScanlineThing<Imf_3_4::InputPart>(&ip,SUB81(pMVar3,0));
  checkDeepTypesFailToLoad(file);
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile(&f,file,iVar1);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                ,0x10e,"void (anonymous namespace)::testScanLineWithBadAttribute(const char *)");
}

Assistant:

void
testScanLineWithBadAttribute (const char* file)
{
    bool caught;

    InputFile in (file);
    readScanlineThing (in, false);

    MultiPartInputFile multiin (file);
    InputPart          ip (multiin, 0);
    readScanlineThing (ip, false);

    checkDeepTypesFailToLoad (file);

    // trying to open it as a tiled file should also fail
    try
    {
        caught = false;
        TiledInputFile f (file);
        assert (false);
    }
    catch (...)
    {
        caught = true;
    }
    assert (caught);

    // trying to open it as a tiled part of a multipart file should fail
    try
    {
        caught = false;
        MultiPartInputFile multiin (file);
        TiledInputPart     p (multiin, 0);
        assert (false);
    }
    catch (...)
    {
        caught = true;
    }
    assert (caught);
}